

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O2

char strbuffer_pop(strbuffer_t *strbuff)

{
  char cVar1;
  size_t sVar2;
  
  sVar2 = strbuff->length;
  if (sVar2 != 0) {
    strbuff->length = sVar2 - 1;
    cVar1 = strbuff->value[sVar2 - 1];
    strbuff->value[sVar2 - 1] = '\0';
    return cVar1;
  }
  return '\0';
}

Assistant:

char strbuffer_pop(strbuffer_t *strbuff)
{
    if(strbuff->length > 0) {
        char c = strbuff->value[--strbuff->length];
        strbuff->value[strbuff->length] = '\0';
        return c;
    }
    else
        return '\0';
}